

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_region.cpp
# Opt level: O0

void __thiscall
Region_OneLargeOneSmallRegion_Test::TestBody(Region_OneLargeOneSmallRegion_Test *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  pointer *this_01;
  bool bVar1;
  Message *message;
  char *pcVar2;
  __shared_ptr_access<pstore::memory_mapper_base,_(__gnu_cxx::_Lock_policy)2,_false,_false> *p_Var3;
  element_type *peVar4;
  element_type *peVar5;
  char *in_R9;
  string local_298;
  AssertHelper local_278;
  Message local_270;
  bool local_261;
  undefined1 local_260 [8];
  AssertionResult gtest_ar__1;
  Message local_248;
  uint64_t local_240;
  undefined1 local_238 [8];
  AssertionResult gtest_ar_6;
  Message local_220;
  uint64_t local_218;
  undefined1 local_210 [8];
  AssertionResult gtest_ar_5;
  Message local_1f8;
  undefined1 local_1f0 [8];
  AssertionResult gtest_ar_4;
  element_type *local_1d0;
  void *actual;
  uint8_t *expected;
  element_type *region1;
  AssertHelper local_198;
  Message local_190;
  bool local_181;
  undefined1 local_180 [8];
  AssertionResult gtest_ar_;
  Message local_168;
  uint64_t local_160;
  undefined1 local_158 [8];
  AssertionResult gtest_ar_3;
  Message local_140;
  uint64_t local_138;
  uint local_12c;
  undefined1 local_128 [8];
  AssertionResult gtest_ar_2;
  Message local_110;
  undefined1 local_108 [16];
  undefined1 local_f8 [8];
  AssertionResult gtest_ar_1;
  element_type *region0;
  AssertHelper local_d8;
  Message local_d0;
  size_type local_c8;
  uint local_bc;
  undefined1 local_b8 [8];
  AssertionResult gtest_ar;
  vector<std::shared_ptr<pstore::memory_mapper_base>,_std::allocator<std::shared_ptr<pstore::memory_mapper_base>_>_>
  result;
  undefined1 local_80 [8];
  mem_based_factory factory;
  undefined1 local_48 [8];
  shared_ptr<pstore::file::in_memory> file;
  shared_ptr<unsigned_char> sp;
  size_t file_size;
  size_t small_region_size;
  size_t big_region_size;
  Region_OneLargeOneSmallRegion_Test *this_local;
  
  small_region_size = 0x20;
  file_size = 0x10;
  sp.super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x30;
  this_00 = &file.super___shared_ptr<pstore::file::in_memory,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount;
  big_region_size = (size_t)this;
  anon_unknown.dwarf_1ca3d2::Region::make_array((Region *)this_00,(size_t)this);
  std::
  make_shared<pstore::file::in_memory,std::shared_ptr<unsigned_char>&,unsigned_long_const&,unsigned_long_const&>
            ((shared_ptr<unsigned_char> *)local_48,(unsigned_long *)this_00,
             (unsigned_long *)
             &sp.super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  this_01 = &result.
             super__Vector_base<std::shared_ptr<pstore::memory_mapper_base>,_std::allocator<std::shared_ptr<pstore::memory_mapper_base>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  std::shared_ptr<pstore::file::in_memory>::shared_ptr
            ((shared_ptr<pstore::file::in_memory> *)this_01,
             (shared_ptr<pstore::file::in_memory> *)local_48);
  pstore::region::mem_based_factory::mem_based_factory
            ((mem_based_factory *)local_80,(shared_ptr<pstore::file::in_memory> *)this_01,0x20,0x10)
  ;
  std::shared_ptr<pstore::file::in_memory>::~shared_ptr
            ((shared_ptr<pstore::file::in_memory> *)
             &result.
              super__Vector_base<std::shared_ptr<pstore::memory_mapper_base>,_std::allocator<std::shared_ptr<pstore::memory_mapper_base>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  pstore::region::mem_based_factory::init
            ((mem_based_factory *)&gtest_ar.message_,(EVP_PKEY_CTX *)local_80);
  local_bc = 2;
  local_c8 = std::
             vector<std::shared_ptr<pstore::memory_mapper_base>,_std::allocator<std::shared_ptr<pstore::memory_mapper_base>_>_>
             ::size((vector<std::shared_ptr<pstore::memory_mapper_base>,_std::allocator<std::shared_ptr<pstore::memory_mapper_base>_>_>
                     *)&gtest_ar.message_);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((EqHelper *)local_b8,"2U","result.size ()",&local_bc,&local_c8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b8);
  if (!bVar1) {
    testing::Message::Message(&local_d0);
    message = testing::Message::operator<<
                        (&local_d0,
                         (char (*) [52])"The region factory did not return exactly 2 regions");
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_b8);
    testing::internal::AssertHelper::AssertHelper
              (&local_d8,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_region.cpp"
               ,0x57,pcVar2);
    testing::internal::AssertHelper::operator=(&local_d8,message);
    testing::internal::AssertHelper::~AssertHelper(&local_d8);
    testing::Message::~Message(&local_d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b8);
  if (bVar1) {
    p_Var3 = (__shared_ptr_access<pstore::memory_mapper_base,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)std::
                vector<std::shared_ptr<pstore::memory_mapper_base>,_std::allocator<std::shared_ptr<pstore::memory_mapper_base>_>_>
                ::at((vector<std::shared_ptr<pstore::memory_mapper_base>,_std::allocator<std::shared_ptr<pstore::memory_mapper_base>_>_>
                      *)&gtest_ar.message_,0);
    gtest_ar_1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )std::
           __shared_ptr_access<pstore::memory_mapper_base,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator*(p_Var3);
    pstore::memory_mapper_base::data((memory_mapper_base *)local_108);
    testing::internal::EqHelper::
    Compare<std::shared_ptr<unsigned_char>,_std::shared_ptr<const_void>,_nullptr>
              ((EqHelper *)local_f8,"sp","region0.data ()",
               (shared_ptr<unsigned_char> *)
               &file.super___shared_ptr<pstore::file::in_memory,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,(shared_ptr<const_void> *)local_108);
    std::shared_ptr<const_void>::~shared_ptr((shared_ptr<const_void> *)local_108);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f8);
    if (!bVar1) {
      testing::Message::Message(&local_110);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_f8);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_region.cpp"
                 ,0x5b,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_110);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
      testing::Message::~Message(&local_110);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_f8);
    local_12c = 0;
    local_138 = pstore::memory_mapper_base::offset
                          ((memory_mapper_base *)
                           gtest_ar_1.message_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl);
    testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
              ((EqHelper *)local_128,"0U","region0.offset ()",&local_12c,&local_138);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_128);
    if (!bVar1) {
      testing::Message::Message(&local_140);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_128);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_region.cpp"
                 ,0x5c,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_140);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
      testing::Message::~Message(&local_140);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_128);
    local_160 = pstore::memory_mapper_base::size
                          ((memory_mapper_base *)
                           gtest_ar_1.message_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl);
    testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
              ((EqHelper *)local_158,"big_region_size","region0.size ()",&small_region_size,
               &local_160);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_158);
    if (!bVar1) {
      testing::Message::Message(&local_168);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_158);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_region.cpp"
                 ,0x5d,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_.message_,&local_168);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
      testing::Message::~Message(&local_168);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_158);
    local_181 = pstore::memory_mapper_base::is_writable
                          ((memory_mapper_base *)
                           gtest_ar_1.message_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_180,&local_181,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_180);
    if (!bVar1) {
      testing::Message::Message(&local_190);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&region1,(internal *)local_180,
                 (AssertionResult *)"region0.is_writable ()","false","true",in_R9);
      pcVar2 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_198,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_region.cpp"
                 ,0x5e,pcVar2);
      testing::internal::AssertHelper::operator=(&local_198,&local_190);
      testing::internal::AssertHelper::~AssertHelper(&local_198);
      std::__cxx11::string::~string((string *)&region1);
      testing::Message::~Message(&local_190);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_180);
    p_Var3 = (__shared_ptr_access<pstore::memory_mapper_base,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)std::
                vector<std::shared_ptr<pstore::memory_mapper_base>,_std::allocator<std::shared_ptr<pstore::memory_mapper_base>_>_>
                ::at((vector<std::shared_ptr<pstore::memory_mapper_base>,_std::allocator<std::shared_ptr<pstore::memory_mapper_base>_>_>
                      *)&gtest_ar.message_,1);
    expected = (uint8_t *)
               std::
               __shared_ptr_access<pstore::memory_mapper_base,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator*(p_Var3);
    peVar4 = std::__shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>::get
                       ((__shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2> *)
                        &file.
                         super___shared_ptr<pstore::file::in_memory,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount);
    actual = peVar4 + 0x20;
    pstore::memory_mapper_base::data((memory_mapper_base *)&gtest_ar_4.message_);
    peVar5 = std::__shared_ptr<const_void,_(__gnu_cxx::_Lock_policy)2>::get
                       ((__shared_ptr<const_void,_(__gnu_cxx::_Lock_policy)2> *)&gtest_ar_4.message_
                       );
    std::shared_ptr<const_void>::~shared_ptr((shared_ptr<const_void> *)&gtest_ar_4.message_);
    local_1d0 = peVar5;
    testing::internal::EqHelper::Compare<const_unsigned_char_*,_const_void_*,_nullptr>
              ((EqHelper *)local_1f0,"expected","actual",(uchar **)&actual,&local_1d0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1f0);
    if (!bVar1) {
      testing::Message::Message(&local_1f8);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1f0);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_region.cpp"
                 ,0x65,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_1f8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
      testing::Message::~Message(&local_1f8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_1f0);
    local_218 = pstore::memory_mapper_base::offset((memory_mapper_base *)expected);
    testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
              ((EqHelper *)local_210,"big_region_size","region1.offset ()",&small_region_size,
               &local_218);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_210);
    if (!bVar1) {
      testing::Message::Message(&local_220);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_210);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_region.cpp"
                 ,0x66,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6.message_,&local_220);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
      testing::Message::~Message(&local_220);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_210);
    local_240 = pstore::memory_mapper_base::size((memory_mapper_base *)expected);
    testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
              ((EqHelper *)local_238,"small_region_size","region1.size ()",&file_size,&local_240);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_238);
    if (!bVar1) {
      testing::Message::Message(&local_248);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_238);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar__1.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_region.cpp"
                 ,0x67,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__1.message_,&local_248);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__1.message_);
      testing::Message::~Message(&local_248);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_238);
    local_261 = pstore::memory_mapper_base::is_writable((memory_mapper_base *)expected);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_260,&local_261,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_260);
    if (!bVar1) {
      testing::Message::Message(&local_270);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_298,(internal *)local_260,(AssertionResult *)"region1.is_writable ()",
                 "false","true",in_R9);
      pcVar2 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_278,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_region.cpp"
                 ,0x68,pcVar2);
      testing::internal::AssertHelper::operator=(&local_278,&local_270);
      testing::internal::AssertHelper::~AssertHelper(&local_278);
      std::__cxx11::string::~string((string *)&local_298);
      testing::Message::~Message(&local_270);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_260);
  }
  std::
  vector<std::shared_ptr<pstore::memory_mapper_base>,_std::allocator<std::shared_ptr<pstore::memory_mapper_base>_>_>
  ::~vector((vector<std::shared_ptr<pstore::memory_mapper_base>,_std::allocator<std::shared_ptr<pstore::memory_mapper_base>_>_>
             *)&gtest_ar.message_);
  pstore::region::mem_based_factory::~mem_based_factory((mem_based_factory *)local_80);
  std::shared_ptr<pstore::file::in_memory>::~shared_ptr
            ((shared_ptr<pstore::file::in_memory> *)local_48);
  std::shared_ptr<unsigned_char>::~shared_ptr
            ((shared_ptr<unsigned_char> *)
             &file.super___shared_ptr<pstore::file::in_memory,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return;
}

Assistant:

TEST_F (Region, OneLargeOneSmallRegion) {
    constexpr std::size_t big_region_size = 32;
    constexpr std::size_t small_region_size = 16;
    constexpr std::size_t file_size = big_region_size + small_region_size;

    auto sp = this->make_array (file_size);
    auto file = std::make_shared<pstore::file::in_memory> (sp, file_size, file_size);

    pstore::region::mem_based_factory factory (file, big_region_size, small_region_size);
    std::vector<std::shared_ptr<pstore::memory_mapper_base>> result = factory.init ();

    ASSERT_EQ (2U, result.size ()) << "The region factory did not return exactly 2 regions";
    {
        auto const & region0 = *(result.at (0));

        EXPECT_EQ (sp, region0.data ());
        EXPECT_EQ (0U, region0.offset ());
        EXPECT_EQ (big_region_size, region0.size ());
        EXPECT_TRUE (region0.is_writable ());
    }
    {
        auto const & region1 = *(result.at (1));
        std::uint8_t const * expected = sp.get () + big_region_size;
        void const * actual = region1.data ().get ();

        EXPECT_EQ (expected, actual);
        EXPECT_EQ (big_region_size, region1.offset ());
        EXPECT_EQ (small_region_size, region1.size ());
        EXPECT_TRUE (region1.is_writable ());
    }
}